

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::read_content_core
          (Server *this,Stream *strm,Request *req,Response *res,ContentReceiver *receiver,
          MultipartContentHeader *mulitpart_header,ContentReceiver *multipart_receiver)

{
  size_t payload_max_length;
  bool bVar1;
  function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> local_218;
  function<bool_(unsigned_long,_unsigned_long)> local_1f8;
  function<bool_(const_char_*,_unsigned_long)> local_1d8;
  anon_class_24_3_23d8765b local_1b8;
  uint local_19c;
  undefined1 local_198 [8];
  string boundary;
  string *content_type;
  undefined1 local_140 [8];
  ContentReceiverWithProgress out;
  MultipartFormDataParser multipart_form_data_parser;
  MultipartContentHeader *mulitpart_header_local;
  ContentReceiver *receiver_local;
  Response *res_local;
  Request *req_local;
  Stream *strm_local;
  Server *this_local;
  
  detail::MultipartFormDataParser::MultipartFormDataParser
            ((MultipartFormDataParser *)&out._M_invoker);
  std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
            ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)local_140
            );
  bVar1 = Request::is_multipart_form_data(req);
  if (bVar1) {
    Request::get_header_value_abi_cxx11_
              ((string *)((long)&boundary.field_2 + 8),req,"Content-Type",0);
    std::__cxx11::string::string((string *)local_198);
    bVar1 = detail::parse_multipart_boundary
                      ((string *)((long)&boundary.field_2 + 8),(string *)local_198);
    if (bVar1) {
      detail::MultipartFormDataParser::set_boundary
                ((MultipartFormDataParser *)&out._M_invoker,(string *)local_198);
      local_1b8.multipart_form_data_parser = (MultipartFormDataParser *)&out._M_invoker;
      local_1b8.multipart_receiver = multipart_receiver;
      local_1b8.mulitpart_header = mulitpart_header;
      std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::operator=
                ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)local_140,
                 &local_1b8);
    }
    else {
      res->status = 400;
      this_local._7_1_ = 0;
    }
    local_19c = (uint)!bVar1;
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)(boundary.field_2._M_local_buf + 8));
    if (local_19c != 0) goto LAB_001abc94;
  }
  else {
    std::function<bool_(const_char_*,_unsigned_long)>::function(&local_1d8,receiver);
    std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::operator=
              ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)local_140,
               (anon_class_32_1_b7b80f6d *)&local_1d8);
    read_content_core(httplib::Stream&,httplib::Request&,httplib::Response&,std::function<bool(char_const*,unsigned_long)>,std::function<bool(httplib::MultipartFormData_const&)>,std::function<bool(char_const*,unsigned_long)>)
    ::{lambda(char_const*,unsigned_long,unsigned_long,unsigned_long)#2}::~function
              ((_lambda_char_const__unsigned_long_unsigned_long_unsigned_long__2_ *)&local_1d8);
  }
  bVar1 = std::operator==(&req->method,"DELETE");
  if ((!bVar1) || (bVar1 = Request::has_header(req,"Content-Length"), bVar1)) {
    payload_max_length = this->payload_max_length_;
    std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_1f8,(nullptr_t)0x0);
    std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
              (&local_218,
               (function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
               local_140);
    bVar1 = detail::read_content<httplib::Request>
                      (strm,req,payload_max_length,&res->status,&local_1f8,&local_218,true);
    std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
              (&local_218);
    std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_1f8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = Request::is_multipart_form_data(req);
      if ((!bVar1) ||
         (bVar1 = detail::MultipartFormDataParser::is_valid
                            ((MultipartFormDataParser *)&out._M_invoker), bVar1)) {
        this_local._7_1_ = 1;
        local_19c = 1;
      }
      else {
        res->status = 400;
        this_local._7_1_ = 0;
        local_19c = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
      local_19c = 1;
    }
  }
  else {
    this_local._7_1_ = 1;
    local_19c = 1;
  }
LAB_001abc94:
  std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
            ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)local_140
            );
  detail::MultipartFormDataParser::~MultipartFormDataParser
            ((MultipartFormDataParser *)&out._M_invoker);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool Server::read_content_core(Stream &strm, Request &req, Response &res,
                                      ContentReceiver receiver,
                                      MultipartContentHeader mulitpart_header,
                                      ContentReceiver multipart_receiver) {
  detail::MultipartFormDataParser multipart_form_data_parser;
  ContentReceiverWithProgress out;

  if (req.is_multipart_form_data()) {
    const auto &content_type = req.get_header_value("Content-Type");
    std::string boundary;
    if (!detail::parse_multipart_boundary(content_type, boundary)) {
      res.status = 400;
      return false;
    }

    multipart_form_data_parser.set_boundary(std::move(boundary));
    out = [&](const char *buf, size_t n, uint64_t /*off*/, uint64_t /*len*/) {
      /* For debug
      size_t pos = 0;
      while (pos < n) {
        auto read_size = (std::min)<size_t>(1, n - pos);
        auto ret = multipart_form_data_parser.parse(
            buf + pos, read_size, multipart_receiver, mulitpart_header);
        if (!ret) { return false; }
        pos += read_size;
      }
      return true;
      */
      return multipart_form_data_parser.parse(buf, n, multipart_receiver,
                                              mulitpart_header);
    };
  } else {
    out = [receiver](const char *buf, size_t n, uint64_t /*off*/,
                     uint64_t /*len*/) { return receiver(buf, n); };
  }

  if (req.method == "DELETE" && !req.has_header("Content-Length")) {
    return true;
  }

  if (!detail::read_content(strm, req, payload_max_length_, res.status, nullptr,
                            out, true)) {
    return false;
  }

  if (req.is_multipart_form_data()) {
    if (!multipart_form_data_parser.is_valid()) {
      res.status = 400;
      return false;
    }
  }

  return true;
}